

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strparse.c
# Opt level: O2

int Curl_str_untilnl(char **linep,Curl_str *out,size_t max)

{
  char *pcVar1;
  size_t sVar2;
  uint uVar3;
  
  pcVar1 = *linep;
  out->str = (char *)0x0;
  out->len = 0;
  sVar2 = 0;
  while ((uVar3 = (uint)(byte)pcVar1[sVar2], 0xd < uVar3 || ((0x2401U >> (uVar3 & 0x1f) & 1) == 0)))
  {
    sVar2 = sVar2 + 1;
    if (max < sVar2) {
      return 1;
    }
  }
  if (sVar2 != 0) {
    out->str = *linep;
    out->len = sVar2;
    *linep = pcVar1 + sVar2;
    return 0;
  }
  return 2;
}

Assistant:

int Curl_str_untilnl(const char **linep, struct Curl_str *out,
                     const size_t max)
{
  const char *s = *linep;
  size_t len = 0;
  DEBUGASSERT(linep && *linep && out && max);

  Curl_str_init(out);
  while(*s && !ISNEWLINE(*s)) {
    s++;
    if(++len > max)
      return STRE_BIG;
  }
  if(!len)
    return STRE_SHORT;
  out->str = *linep;
  out->len = len;
  *linep = s; /* point to the first byte after the word */
  return STRE_OK;
}